

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O1

Frame * __thiscall Frame::prepend(Frame *this,void *data,size_t size)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  size_t sVar3;
  ulong uVar4;
  uint8_t *__dest;
  pointer __old_p;
  
  _Var1._M_head_impl =
       (this->m_Data)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar4 = (long)this->m_Pos - (long)_Var1._M_head_impl;
  if (uVar4 < size) {
    sVar3 = this->m_Size;
    _Var2._M_head_impl = (uchar *)operator_new__(size + sVar3);
    this->m_Pos = _Var2._M_head_impl + uVar4 + size;
    memcpy(_Var2._M_head_impl + uVar4 + size,_Var1._M_head_impl + uVar4,sVar3 - uVar4);
    (this->m_Data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Var1._M_head_impl);
    }
    sVar3 = this->m_Size + size;
    this->m_Size = sVar3;
    this->m_OriginalSize = sVar3;
    __dest = (this->m_Data)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar4;
  }
  else {
    __dest = this->m_Pos + -size;
  }
  this->m_Pos = __dest;
  memcpy(__dest,data,size);
  return this;
}

Assistant:

Frame& Frame::prepend(const void* const data, const size_t size)
{
    const size_t bytesFree = m_Pos - m_Data.get();
    if (size > bytesFree) {
        auto newData = new uint8_t[size + m_Size];

        m_Pos = newData + bytesFree + size;
        memcpy(m_Pos, m_Data.get() + bytesFree, m_Size - bytesFree);
        m_Data.reset(newData);
        m_Size += size;
        m_OriginalSize = m_Size;
        m_Pos = m_Data.get() + bytesFree;
    } else {
        m_Pos -= size;
    }
    memcpy(m_Pos, data, size);
    return *this;
}